

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void FFT::Backward(UnityComplexNumber *data,int numsamples,bool highprecision)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,highprecision) == 0) {
    FFTProcess<float>(data,numsamples,false);
  }
  else {
    FFTProcess<double>(data,numsamples,false);
  }
  if (0 < numsamples) {
    uVar1 = 0;
    do {
      data[uVar1].re = data[uVar1].re * (1.0 / (float)numsamples);
      data[uVar1].im = data[uVar1].im * (1.0 / (float)numsamples);
      uVar1 = uVar1 + 1;
    } while ((uint)numsamples != uVar1);
  }
  return;
}

Assistant:

void FFT::Backward(UnityComplexNumber* data, int numsamples, bool highprecision)
{
    if (highprecision)
        FFTProcess<double>(data, numsamples, false);
    else
        FFTProcess<float>(data, numsamples, false);

    const float scale = 1.0f / (float)numsamples;
    for (int n = 0; n < numsamples; n++)
    {
        data[n].re *= scale;
        data[n].im *= scale;
    }
}